

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCov.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ddd3::CCov::addCoverageTraceCall
          (CCov *this,Instruction *Inst,FunctionCallee CoverageFunction)

{
  uint32_t C;
  undefined1 Str [16];
  uint32_t C_00;
  long lVar1;
  Constant *pCVar2;
  uint uVar3;
  bool bVar4;
  ArrayRef<llvm::Value_*> Args_00;
  string FileNameStr;
  Child local_100 [2];
  array<llvm::Value_*,_4UL> Args;
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> Builder;
  
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
            (&Builder,Inst,(MDNode *)0x0,
             (ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>)ZEXT816(0));
  if (this->FileName == (Constant *)0x0) {
    lVar1 = llvm::Instruction::getModule();
    std::__cxx11::string::string((string *)&FileNameStr,(string *)(lVar1 + 0xd0));
    Str = (undefined1  [16])FileNameStr._0_16_;
    llvm::Twine::Twine((Twine *)&local_100[0].ptrAndLength,"");
    pCVar2 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       (&Builder.super_IRBuilderBase,(StringRef)Str,
                        (Twine *)&local_100[0].ptrAndLength,0,(Module *)0x0);
    this->FileName = pCVar2;
    std::__cxx11::string::~string((string *)&FileNameStr);
  }
  Args._M_elems[1] = (Value *)this->FunctionName;
  bVar4 = Args._M_elems[1] == (Value *)0x0;
  if (bVar4) {
    llvm::Instruction::getFunction();
    local_100[0] = (Child)llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(&FileNameStr,(StringRef *)&local_100[0].ptrAndLength);
    llvm::Twine::Twine((Twine *)&local_100[0].ptrAndLength,"");
    pCVar2 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       (&Builder.super_IRBuilderBase,(StringRef)FileNameStr._0_16_,
                        (Twine *)&local_100[0].ptrAndLength,0,(Module *)0x0);
    this->FunctionName = pCVar2;
    std::__cxx11::string::~string((string *)&FileNameStr);
    Args._M_elems[1] = (Value *)this->FunctionName;
  }
  uVar3 = (uint)bVar4;
  C = uVar3 + 2;
  if (Inst[0x10] != (Instruction)0x1c) {
    C = uVar3;
  }
  Args._M_elems[0] = (Value *)this->FileName;
  C_00 = llvm::DebugLoc::getLine();
  Args._M_elems[2] = (Value *)llvm::IRBuilderBase::getInt32(&Builder.super_IRBuilderBase,C_00);
  Args._M_elems[3] = (Value *)llvm::IRBuilderBase::getInt32(&Builder.super_IRBuilderBase,C);
  llvm::Twine::Twine((Twine *)&local_100[0].ptrAndLength,"");
  Args_00.Length = 4;
  Args_00.Data = Args._M_elems;
  llvm::IRBuilderBase::CreateCall
            (&Builder.super_IRBuilderBase,CoverageFunction.FnTy,CoverageFunction.Callee,Args_00,
             (Twine *)&local_100[0].ptrAndLength,(MDNode *)0x0);
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::~IRBuilder(&Builder);
  return;
}

Assistant:

void CCov::addCoverageTraceCall(Instruction *Inst,
    FunctionCallee CoverageFunction) {
  IRBuilder<> Builder(Inst);
  const DebugLoc &Loc = Inst->getDebugLoc();
  std::array<Value *, 4> Args;
  uint32_t Attribute = 0;
  if (!FileName) {
    std::string FileNameStr = Inst->getModule()->getSourceFileName();
    FileName = Builder.CreateGlobalStringPtr(FileNameStr);
  }
  if (!FunctionName) {
    std::string FunctionNameStr = Inst->getFunction()->getName().str();
    FunctionName = Builder.CreateGlobalStringPtr(FunctionNameStr);
    Attribute |= CCov_Entry;
  }
  if (Inst->getOpcode() == Instruction::Ret)
    Attribute |= CCov_Ret;
  Args[0] = FileName;
  Args[1] = FunctionName;
  Args[2] = Builder.getInt32((uint32_t)Loc.getLine());
  Args[3] = Builder.getInt32(Attribute);
  Builder.CreateCall(CoverageFunction, ArrayRef<Value *>(Args));
}